

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O3

void ncnn::pack_A_tile_fp32_to_int8_avx2
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  void *pvVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  size_t *psVar16;
  undefined1 (*pauVar17) [16];
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  undefined1 (*pauVar31) [32];
  ulong *puVar32;
  long lVar33;
  long lVar34;
  __m128i _vindex;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar81 [16];
  float fVar80;
  float fVar96;
  undefined1 auVar86 [32];
  undefined1 auVar82 [16];
  undefined1 auVar88 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar94;
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 in_ZMM10 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar100;
  undefined1 auVar104 [32];
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 in_ZMM11 [64];
  undefined1 auVar105 [64];
  undefined1 auVar112 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  
  iVar15 = cpu_support_x86_avx_vnni_int8();
  if (iVar15 != 0) {
    pack_A_tile_fp32_to_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk,scales);
    return;
  }
  iVar15 = cpu_support_x86_avx_vnni();
  auVar35 = _DAT_005b0fa0;
  if (iVar15 == 0) {
    psVar16 = (size_t *)&A->w;
    if (A->dims == 3) {
      psVar16 = &A->cstep;
    }
    iVar15 = A->elempack;
    iVar20 = (int)*psVar16;
    pauVar17 = (undefined1 (*) [16])AT->data;
    uVar30 = 0;
    lVar21 = (long)i;
    lVar18 = (long)iVar20;
    if (7 < max_ii) {
      lVar23 = (long)(iVar20 << 2);
      auVar112._4_4_ = iVar20;
      auVar112._0_4_ = iVar20;
      auVar112._8_4_ = iVar20;
      auVar112._12_4_ = iVar20;
      auVar112._16_4_ = iVar20;
      auVar112._20_4_ = iVar20;
      auVar112._24_4_ = iVar20;
      auVar112._28_4_ = iVar20;
      vpmulld_avx2(auVar112,_DAT_005a5920);
      uVar24 = max_kk & 0xfffffffe;
      auVar44._8_4_ = 0x80000000;
      auVar44._0_8_ = 0x8000000080000000;
      auVar44._12_4_ = 0x80000000;
      auVar44._16_4_ = 0x80000000;
      auVar44._20_4_ = 0x80000000;
      auVar44._24_4_ = 0x80000000;
      auVar44._28_4_ = 0x80000000;
      auVar48._8_4_ = 0x3f000000;
      auVar48._0_8_ = 0x3f0000003f000000;
      auVar48._12_4_ = 0x3f000000;
      auVar48._16_4_ = 0x3f000000;
      auVar48._20_4_ = 0x3f000000;
      auVar48._24_4_ = 0x3f000000;
      auVar48._28_4_ = 0x3f000000;
      auVar52._8_2_ = 0x7f;
      auVar52._0_8_ = 0x7f007f007f007f;
      auVar52._10_2_ = 0x7f;
      auVar52._12_2_ = 0x7f;
      auVar52._14_2_ = 0x7f;
      auVar52._16_2_ = 0x7f;
      auVar52._18_2_ = 0x7f;
      auVar52._20_2_ = 0x7f;
      auVar52._22_2_ = 0x7f;
      auVar52._24_2_ = 0x7f;
      auVar52._26_2_ = 0x7f;
      auVar52._28_2_ = 0x7f;
      auVar52._30_2_ = 0x7f;
      auVar54._8_2_ = 0xff81;
      auVar54._0_8_ = 0xff81ff81ff81ff81;
      auVar54._10_2_ = 0xff81;
      auVar54._12_2_ = 0xff81;
      auVar54._14_2_ = 0xff81;
      auVar54._16_2_ = 0xff81;
      auVar54._18_2_ = 0xff81;
      auVar54._20_2_ = 0xff81;
      auVar54._22_2_ = 0xff81;
      auVar54._24_2_ = 0xff81;
      auVar54._26_2_ = 0xff81;
      auVar54._28_2_ = 0xff81;
      auVar54._30_2_ = 0xff81;
      in_ZMM6 = ZEXT1664(_DAT_005b0fa0);
      auVar66._8_2_ = 0x7f;
      auVar66._0_8_ = 0x7f007f007f007f;
      auVar66._10_2_ = 0x7f;
      auVar66._12_2_ = 0x7f;
      auVar66._14_2_ = 0x7f;
      auVar72._8_2_ = 0xff81;
      auVar72._0_8_ = 0xff81ff81ff81ff81;
      auVar72._10_2_ = 0xff81;
      auVar72._12_2_ = 0xff81;
      auVar72._14_2_ = 0xff81;
      uVar25 = 0;
      do {
        pauVar31 = (undefined1 (*) [32])
                   ((long)A->data + (long)(iVar15 * k) * 4 + (uVar25 + lVar21) * lVar18 * 4);
        auVar112 = *(undefined1 (*) [32])((long)scales->data + uVar25 * 4 + lVar21 * 4);
        fVar2 = auVar112._0_4_;
        fVar3 = auVar112._4_4_;
        fVar10 = auVar112._8_4_;
        fVar6 = auVar112._12_4_;
        fVar7 = auVar112._16_4_;
        fVar8 = auVar112._20_4_;
        fVar9 = auVar112._24_4_;
        if (iVar15 == 8) {
          uVar22 = 0;
          if (1 < max_kk) {
            iVar19 = 1;
            do {
              auVar90._0_4_ = fVar2 * *(float *)*pauVar31;
              auVar90._4_4_ = fVar3 * *(float *)(*pauVar31 + 4);
              auVar90._8_4_ = fVar10 * *(float *)(*pauVar31 + 8);
              auVar90._12_4_ = fVar6 * *(float *)(*pauVar31 + 0xc);
              auVar90._16_4_ = fVar7 * *(float *)(*pauVar31 + 0x10);
              auVar90._20_4_ = fVar8 * *(float *)(*pauVar31 + 0x14);
              auVar90._28_36_ = in_ZMM10._28_36_;
              auVar90._24_4_ = fVar9 * *(float *)(*pauVar31 + 0x18);
              auVar105._0_4_ = fVar2 * *(float *)pauVar31[1];
              auVar105._4_4_ = fVar3 * *(float *)(pauVar31[1] + 4);
              auVar105._8_4_ = fVar10 * *(float *)(pauVar31[1] + 8);
              auVar105._12_4_ = fVar6 * *(float *)(pauVar31[1] + 0xc);
              auVar105._16_4_ = fVar7 * *(float *)(pauVar31[1] + 0x10);
              auVar105._20_4_ = fVar8 * *(float *)(pauVar31[1] + 0x14);
              auVar105._28_36_ = in_ZMM11._28_36_;
              auVar105._24_4_ = fVar9 * *(float *)(pauVar31[1] + 0x18);
              auVar112 = vandps_avx(auVar90._0_32_,auVar44);
              auVar85 = vandps_avx(auVar105._0_32_,auVar44);
              auVar112 = vorps_avx(auVar112,auVar48);
              auVar85 = vorps_avx(auVar85,auVar48);
              auVar103._0_4_ = (int)(auVar90._0_4_ + auVar112._0_4_);
              auVar103._4_4_ = (int)(auVar90._4_4_ + auVar112._4_4_);
              auVar103._8_4_ = (int)(auVar90._8_4_ + auVar112._8_4_);
              auVar103._12_4_ = (int)(auVar90._12_4_ + auVar112._12_4_);
              auVar103._16_4_ = (int)(auVar90._16_4_ + auVar112._16_4_);
              auVar103._20_4_ = (int)(auVar90._20_4_ + auVar112._20_4_);
              auVar103._24_4_ = (int)(auVar90._24_4_ + auVar112._24_4_);
              auVar103._28_4_ = (int)(in_ZMM10._28_4_ + auVar112._28_4_);
              auVar101._0_4_ = (int)(auVar105._0_4_ + auVar85._0_4_);
              auVar101._4_4_ = (int)(auVar105._4_4_ + auVar85._4_4_);
              auVar101._8_4_ = (int)(auVar105._8_4_ + auVar85._8_4_);
              auVar101._12_4_ = (int)(auVar105._12_4_ + auVar85._12_4_);
              auVar101._16_4_ = (int)(auVar105._16_4_ + auVar85._16_4_);
              auVar101._20_4_ = (int)(auVar105._20_4_ + auVar85._20_4_);
              auVar101._24_4_ = (int)(auVar105._24_4_ + auVar85._24_4_);
              auVar101._28_4_ = (int)(in_ZMM11._28_4_ + auVar85._28_4_);
              auVar112 = vpackssdw_avx2(auVar103,auVar101);
              auVar112 = vpermq_avx2(auVar112,0xd8);
              auVar112 = vpminsw_avx2(auVar112,auVar52);
              auVar112 = vpmaxsw_avx2(auVar112,auVar54);
              in_ZMM11 = ZEXT1664(auVar112._16_16_);
              auVar81 = vpacksswb_avx(auVar112._0_16_,auVar112._16_16_);
              auVar81 = vpshufb_avx(auVar81,auVar35);
              in_ZMM10 = ZEXT1664(auVar81);
              *pauVar17 = auVar81;
              pauVar17 = pauVar17 + 1;
              pauVar31 = pauVar31 + 2;
              iVar19 = iVar19 + 2;
              uVar22 = uVar24;
            } while (iVar19 < max_kk);
          }
          iVar19 = max_kk - uVar22;
          if (iVar19 != 0 && (int)uVar22 <= max_kk) {
            do {
              auVar91._0_4_ = fVar2 * *(float *)*pauVar31;
              auVar91._4_4_ = fVar3 * *(float *)(*pauVar31 + 4);
              auVar91._8_4_ = fVar10 * *(float *)(*pauVar31 + 8);
              auVar91._12_4_ = fVar6 * *(float *)(*pauVar31 + 0xc);
              auVar91._16_4_ = fVar7 * *(float *)(*pauVar31 + 0x10);
              auVar91._20_4_ = fVar8 * *(float *)(*pauVar31 + 0x14);
              auVar91._28_36_ = in_ZMM10._28_36_;
              auVar91._24_4_ = fVar9 * *(float *)(*pauVar31 + 0x18);
              auVar112 = vandps_avx(auVar91._0_32_,auVar44);
              auVar112 = vorps_avx(auVar112,auVar48);
              auVar81._0_4_ = (int)(auVar91._0_4_ + auVar112._0_4_);
              auVar81._4_4_ = (int)(auVar91._4_4_ + auVar112._4_4_);
              auVar81._8_4_ = (int)(auVar91._8_4_ + auVar112._8_4_);
              auVar81._12_4_ = (int)(auVar91._12_4_ + auVar112._12_4_);
              auVar85._16_4_ = (int)(auVar91._16_4_ + auVar112._16_4_);
              auVar85._0_16_ = auVar81;
              auVar85._20_4_ = (int)(auVar91._20_4_ + auVar112._20_4_);
              auVar85._24_4_ = (int)(auVar91._24_4_ + auVar112._24_4_);
              auVar85._28_4_ = (int)(in_ZMM10._28_4_ + auVar112._28_4_);
              in_ZMM11 = ZEXT1664(auVar85._16_16_);
              auVar81 = vpackssdw_avx(auVar81,auVar85._16_16_);
              auVar81 = vpminsw_avx(auVar81,auVar66);
              auVar81 = vpmaxsw_avx(auVar81,auVar72);
              auVar81 = vpacksswb_avx(auVar81,auVar81);
              in_ZMM10 = ZEXT1664(auVar81);
              *(long *)*pauVar17 = auVar81._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pauVar31 = pauVar31 + 1;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
        }
        if (iVar15 == 4) {
          uVar22 = 0;
          if (1 < max_kk) {
            iVar19 = 1;
            do {
              auVar112 = *(undefined1 (*) [32])(*pauVar31 + lVar23 * 4);
              auVar85 = vperm2f128_avx(*pauVar31,auVar112,0x20);
              auVar101 = vperm2f128_avx(*pauVar31,auVar112,0x31);
              fVar100 = auVar85._0_4_ * fVar2;
              fVar106 = auVar85._4_4_ * fVar3;
              auVar11._4_4_ = fVar106;
              auVar11._0_4_ = fVar100;
              fVar107 = auVar85._8_4_ * fVar10;
              auVar11._8_4_ = fVar107;
              fVar108 = auVar85._12_4_ * fVar6;
              auVar11._12_4_ = fVar108;
              fVar109 = auVar85._16_4_ * fVar7;
              auVar11._16_4_ = fVar109;
              fVar110 = auVar85._20_4_ * fVar8;
              auVar11._20_4_ = fVar110;
              fVar111 = auVar85._24_4_ * fVar9;
              auVar11._24_4_ = fVar111;
              auVar11._28_4_ = auVar112._28_4_;
              fVar80 = auVar101._0_4_ * fVar2;
              fVar94 = auVar101._4_4_ * fVar3;
              auVar12._4_4_ = fVar94;
              auVar12._0_4_ = fVar80;
              fVar95 = auVar101._8_4_ * fVar10;
              auVar12._8_4_ = fVar95;
              fVar96 = auVar101._12_4_ * fVar6;
              auVar12._12_4_ = fVar96;
              fVar97 = auVar101._16_4_ * fVar7;
              auVar12._16_4_ = fVar97;
              fVar98 = auVar101._20_4_ * fVar8;
              auVar12._20_4_ = fVar98;
              fVar99 = auVar101._24_4_ * fVar9;
              auVar12._24_4_ = fVar99;
              auVar12._28_4_ = auVar101._28_4_;
              auVar85 = vandps_avx(auVar11,auVar44);
              auVar103 = vandps_avx(auVar12,auVar44);
              auVar85 = vorps_avx(auVar85,auVar48);
              auVar103 = vorps_avx(auVar103,auVar48);
              auVar102._0_4_ = (int)(fVar100 + auVar85._0_4_);
              auVar102._4_4_ = (int)(fVar106 + auVar85._4_4_);
              auVar102._8_4_ = (int)(fVar107 + auVar85._8_4_);
              auVar102._12_4_ = (int)(fVar108 + auVar85._12_4_);
              auVar102._16_4_ = (int)(fVar109 + auVar85._16_4_);
              auVar102._20_4_ = (int)(fVar110 + auVar85._20_4_);
              auVar102._24_4_ = (int)(fVar111 + auVar85._24_4_);
              auVar102._28_4_ = (int)(auVar112._28_4_ + auVar85._28_4_);
              auVar86._0_4_ = (int)(fVar80 + auVar103._0_4_);
              auVar86._4_4_ = (int)(fVar94 + auVar103._4_4_);
              auVar86._8_4_ = (int)(fVar95 + auVar103._8_4_);
              auVar86._12_4_ = (int)(fVar96 + auVar103._12_4_);
              auVar86._16_4_ = (int)(fVar97 + auVar103._16_4_);
              auVar86._20_4_ = (int)(fVar98 + auVar103._20_4_);
              auVar86._24_4_ = (int)(fVar99 + auVar103._24_4_);
              auVar86._28_4_ = (int)(auVar101._28_4_ + auVar103._28_4_);
              auVar112 = vpackssdw_avx2(auVar102,auVar86);
              auVar112 = vpermq_avx2(auVar112,0xd8);
              auVar112 = vpminsw_avx2(auVar112,auVar52);
              auVar112 = vpmaxsw_avx2(auVar112,auVar54);
              in_ZMM11 = ZEXT1664(auVar112._16_16_);
              auVar81 = vpacksswb_avx(auVar112._0_16_,auVar112._16_16_);
              auVar81 = vpshufb_avx(auVar81,auVar35);
              in_ZMM10 = ZEXT1664(auVar81);
              *pauVar17 = auVar81;
              pauVar17 = pauVar17 + 1;
              pauVar31 = pauVar31 + 1;
              iVar19 = iVar19 + 2;
              uVar22 = uVar24;
            } while (iVar19 < max_kk);
          }
          iVar19 = max_kk - uVar22;
          if (iVar19 != 0 && (int)uVar22 <= max_kk) {
            do {
              fVar80 = *(float *)*pauVar31 * fVar2;
              fVar94 = *(float *)(*pauVar31 + 4) * fVar3;
              auVar13._4_4_ = fVar94;
              auVar13._0_4_ = fVar80;
              fVar95 = *(float *)(*pauVar31 + 8) * fVar10;
              auVar13._8_4_ = fVar95;
              fVar96 = *(float *)(*pauVar31 + 0xc) * fVar6;
              auVar13._12_4_ = fVar96;
              fVar97 = *(float *)(*pauVar31 + lVar23 * 4 + 0x10) * fVar7;
              auVar13._16_4_ = fVar97;
              fVar98 = *(float *)(*pauVar31 + lVar23 * 4 + 0x14) * fVar8;
              auVar13._20_4_ = fVar98;
              fVar99 = *(float *)(*pauVar31 + lVar23 * 4 + 0x18) * fVar9;
              auVar13._24_4_ = fVar99;
              auVar13._28_4_ = *(float *)(*pauVar31 + lVar23 * 4 + 0x1c);
              auVar112 = vandps_avx(auVar13,auVar44);
              auVar112 = vorps_avx(auVar112,auVar48);
              auVar82._0_4_ = (int)(fVar80 + auVar112._0_4_);
              auVar82._4_4_ = (int)(fVar94 + auVar112._4_4_);
              auVar82._8_4_ = (int)(fVar95 + auVar112._8_4_);
              auVar82._12_4_ = (int)(fVar96 + auVar112._12_4_);
              auVar87._16_4_ = (int)(fVar97 + auVar112._16_4_);
              auVar87._0_16_ = auVar82;
              auVar87._20_4_ = (int)(fVar98 + auVar112._20_4_);
              auVar87._24_4_ = (int)(fVar99 + auVar112._24_4_);
              auVar87._28_4_ = (int)(*(float *)(*pauVar31 + lVar23 * 4 + 0x1c) + auVar112._28_4_);
              in_ZMM11 = ZEXT1664(auVar87._16_16_);
              auVar81 = vpackssdw_avx(auVar82,auVar87._16_16_);
              auVar81 = vpminsw_avx(auVar81,auVar66);
              auVar81 = vpmaxsw_avx(auVar81,auVar72);
              auVar81 = vpacksswb_avx(auVar81,auVar81);
              in_ZMM10 = ZEXT1664(auVar81);
              *(long *)*pauVar17 = auVar81._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pauVar31 = (undefined1 (*) [32])(*pauVar31 + 0x10);
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
        }
        if (iVar15 == 1) {
          uVar22 = 0;
          if (1 < max_kk) {
            iVar19 = 1;
            do {
              auVar112 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
              auVar103 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar112);
              auVar112 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
              auVar112 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar112);
              auVar92._0_4_ = auVar103._0_4_ * fVar2;
              auVar92._4_4_ = auVar103._4_4_ * fVar3;
              auVar92._8_4_ = auVar103._8_4_ * fVar10;
              auVar92._12_4_ = auVar103._12_4_ * fVar6;
              auVar92._16_4_ = auVar103._16_4_ * fVar7;
              auVar92._20_4_ = auVar103._20_4_ * fVar8;
              auVar92._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
              auVar92._24_4_ = auVar103._24_4_ * fVar9;
              fVar80 = auVar112._0_4_ * fVar2;
              fVar94 = auVar112._4_4_ * fVar3;
              auVar14._4_4_ = fVar94;
              auVar14._0_4_ = fVar80;
              fVar95 = auVar112._8_4_ * fVar10;
              auVar14._8_4_ = fVar95;
              fVar96 = auVar112._12_4_ * fVar6;
              auVar14._12_4_ = fVar96;
              fVar97 = auVar112._16_4_ * fVar7;
              auVar14._16_4_ = fVar97;
              fVar98 = auVar112._20_4_ * fVar8;
              auVar14._20_4_ = fVar98;
              fVar99 = auVar112._24_4_ * fVar9;
              auVar14._24_4_ = fVar99;
              auVar14._28_4_ = auVar103._28_4_;
              auVar112 = vandps_avx(auVar92._0_32_,auVar44);
              auVar85 = vandps_avx(auVar14,auVar44);
              auVar112 = vorps_avx(auVar112,auVar48);
              auVar85 = vorps_avx(auVar85,auVar48);
              auVar88._0_4_ = (int)(auVar92._0_4_ + auVar112._0_4_);
              auVar88._4_4_ = (int)(auVar92._4_4_ + auVar112._4_4_);
              auVar88._8_4_ = (int)(auVar92._8_4_ + auVar112._8_4_);
              auVar88._12_4_ = (int)(auVar92._12_4_ + auVar112._12_4_);
              auVar88._16_4_ = (int)(auVar92._16_4_ + auVar112._16_4_);
              auVar88._20_4_ = (int)(auVar92._20_4_ + auVar112._20_4_);
              auVar88._24_4_ = (int)(auVar92._24_4_ + auVar112._24_4_);
              auVar88._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar112._28_4_)
              ;
              auVar104._0_4_ = (int)(fVar80 + auVar85._0_4_);
              auVar104._4_4_ = (int)(fVar94 + auVar85._4_4_);
              auVar104._8_4_ = (int)(fVar95 + auVar85._8_4_);
              auVar104._12_4_ = (int)(fVar96 + auVar85._12_4_);
              auVar104._16_4_ = (int)(fVar97 + auVar85._16_4_);
              auVar104._20_4_ = (int)(fVar98 + auVar85._20_4_);
              auVar104._24_4_ = (int)(fVar99 + auVar85._24_4_);
              auVar104._28_4_ = (int)(auVar103._28_4_ + auVar85._28_4_);
              auVar112 = vpackssdw_avx2(auVar88,auVar104);
              auVar112 = vpermq_avx2(auVar112,0xd8);
              auVar112 = vpminsw_avx2(auVar112,auVar52);
              auVar112 = vpmaxsw_avx2(auVar112,auVar54);
              in_ZMM11 = ZEXT1664(auVar112._16_16_);
              auVar81 = vpacksswb_avx(auVar112._0_16_,auVar112._16_16_);
              auVar81 = vpshufb_avx(auVar81,auVar35);
              in_ZMM10 = ZEXT1664(auVar81);
              *pauVar17 = auVar81;
              pauVar17 = pauVar17 + 1;
              iVar19 = iVar19 + 2;
              uVar22 = uVar24;
            } while (iVar19 < max_kk);
          }
          iVar19 = max_kk - uVar22;
          if (iVar19 != 0 && (int)uVar22 <= max_kk) {
            do {
              auVar112 = vpcmpeqd_avx2(in_ZMM10._0_32_,in_ZMM10._0_32_);
              auVar112 = vgatherdps(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar112);
              auVar93._0_4_ = auVar112._0_4_ * fVar2;
              auVar93._4_4_ = auVar112._4_4_ * fVar3;
              auVar93._8_4_ = auVar112._8_4_ * fVar10;
              auVar93._12_4_ = auVar112._12_4_ * fVar6;
              auVar93._16_4_ = auVar112._16_4_ * fVar7;
              auVar93._20_4_ = auVar112._20_4_ * fVar8;
              auVar93._28_36_ = SUB6436(ZEXT3264((undefined1  [32])0x0),0x1c);
              auVar93._24_4_ = auVar112._24_4_ * fVar9;
              auVar112 = vandps_avx(auVar93._0_32_,auVar44);
              auVar112 = vorps_avx(auVar112,auVar48);
              auVar83._0_4_ = (int)(auVar93._0_4_ + auVar112._0_4_);
              auVar83._4_4_ = (int)(auVar93._4_4_ + auVar112._4_4_);
              auVar83._8_4_ = (int)(auVar93._8_4_ + auVar112._8_4_);
              auVar83._12_4_ = (int)(auVar93._12_4_ + auVar112._12_4_);
              auVar89._16_4_ = (int)(auVar93._16_4_ + auVar112._16_4_);
              auVar89._0_16_ = auVar83;
              auVar89._20_4_ = (int)(auVar93._20_4_ + auVar112._20_4_);
              auVar89._24_4_ = (int)(auVar93._24_4_ + auVar112._24_4_);
              auVar89._28_4_ = (int)(SUB644(ZEXT3264((undefined1  [32])0x0),0x1c) + auVar112._28_4_)
              ;
              in_ZMM11 = ZEXT1664(auVar89._16_16_);
              auVar81 = vpackssdw_avx(auVar83,auVar89._16_16_);
              auVar81 = vpminsw_avx(auVar81,auVar66);
              auVar81 = vpmaxsw_avx(auVar81,auVar72);
              auVar81 = vpacksswb_avx(auVar81,auVar81);
              in_ZMM10 = ZEXT1664(auVar81);
              *(long *)*pauVar17 = auVar81._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
        }
        uVar30 = uVar25 + 8;
        uVar29 = uVar25 + 0xf;
        uVar25 = uVar30;
      } while (uVar29 < (uint)max_ii);
    }
    lVar23 = (long)max_ii;
    if ((int)((uint)uVar30 | 3) < max_ii) {
      pvVar4 = A->data;
      pvVar5 = scales->data;
      auVar35._4_4_ = iVar20;
      auVar35._0_4_ = iVar20;
      auVar35._8_4_ = iVar20;
      auVar35._12_4_ = iVar20;
      vpmulld_avx(auVar35,_DAT_005a3f50);
      auVar38._8_4_ = 0x80000000;
      auVar38._0_8_ = 0x8000000080000000;
      auVar38._12_4_ = 0x80000000;
      auVar41._8_4_ = 0x3f000000;
      auVar41._0_8_ = 0x3f0000003f000000;
      auVar41._12_4_ = 0x3f000000;
      auVar45._8_2_ = 0x7f;
      auVar45._0_8_ = 0x7f007f007f007f;
      auVar45._10_2_ = 0x7f;
      auVar45._12_2_ = 0x7f;
      auVar45._14_2_ = 0x7f;
      auVar49._8_2_ = 0xff81;
      auVar49._0_8_ = 0xff81ff81ff81ff81;
      auVar49._10_2_ = 0xff81;
      auVar49._12_2_ = 0xff81;
      auVar49._14_2_ = 0xff81;
      uVar25 = uVar30 & 0xffffffff;
      do {
        pfVar27 = (float *)((long)pvVar4 + (uVar25 + lVar21) * lVar18 * 4 + (long)(iVar15 * k) * 4);
        pfVar1 = (float *)((long)pvVar5 + uVar25 * 4 + lVar21 * 4);
        fVar2 = *pfVar1;
        fVar3 = pfVar1[1];
        fVar10 = pfVar1[2];
        fVar6 = pfVar1[3];
        if (iVar15 == 4) {
          uVar24 = 0;
          if (1 < max_kk) {
            iVar20 = 1;
            do {
              auVar55._0_4_ = fVar2 * *pfVar27;
              auVar55._4_4_ = fVar3 * pfVar27[1];
              auVar55._8_4_ = fVar10 * pfVar27[2];
              auVar55._12_4_ = fVar6 * pfVar27[3];
              auVar67._0_4_ = fVar2 * pfVar27[4];
              auVar67._4_4_ = fVar3 * pfVar27[5];
              auVar67._8_4_ = fVar10 * pfVar27[6];
              auVar67._12_4_ = fVar6 * pfVar27[7];
              auVar81 = vunpcklps_avx(auVar55,auVar67);
              auVar72 = vunpckhps_avx(auVar55,auVar67);
              auVar35 = vandps_avx(auVar81,auVar38);
              auVar66 = vandps_avx(auVar72,auVar38);
              auVar35 = vorps_avx(auVar35,auVar41);
              auVar66 = vorps_avx(auVar66,auVar41);
              auVar68._0_4_ = (int)(auVar81._0_4_ + auVar35._0_4_);
              auVar68._4_4_ = (int)(auVar81._4_4_ + auVar35._4_4_);
              auVar68._8_4_ = (int)(auVar81._8_4_ + auVar35._8_4_);
              auVar68._12_4_ = (int)(auVar81._12_4_ + auVar35._12_4_);
              auVar56._0_4_ = (int)(auVar66._0_4_ + auVar72._0_4_);
              auVar56._4_4_ = (int)(auVar66._4_4_ + auVar72._4_4_);
              auVar56._8_4_ = (int)(auVar66._8_4_ + auVar72._8_4_);
              auVar56._12_4_ = (int)(auVar66._12_4_ + auVar72._12_4_);
              auVar35 = vpackssdw_avx(auVar68,auVar56);
              auVar35 = vpminsw_avx(auVar35,auVar45);
              auVar35 = vpmaxsw_avx(auVar35,auVar49);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              in_ZMM6 = ZEXT1664(auVar35);
              *(long *)*pauVar17 = auVar35._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              pfVar27 = pfVar27 + 8;
              iVar20 = iVar20 + 2;
              uVar24 = max_kk & 0xfffffffeU;
            } while (iVar20 < max_kk);
          }
          iVar20 = max_kk - uVar24;
          if (iVar20 != 0 && (int)uVar24 <= max_kk) {
            do {
              auVar57._0_4_ = fVar2 * *pfVar27;
              auVar57._4_4_ = fVar3 * pfVar27[1];
              auVar57._8_4_ = fVar10 * pfVar27[2];
              auVar57._12_4_ = fVar6 * pfVar27[3];
              auVar35 = vandps_avx(auVar57,auVar38);
              auVar35 = vorps_avx(auVar35,auVar41);
              auVar58._0_4_ = (int)(auVar57._0_4_ + auVar35._0_4_);
              auVar58._4_4_ = (int)(auVar57._4_4_ + auVar35._4_4_);
              auVar58._8_4_ = (int)(auVar57._8_4_ + auVar35._8_4_);
              auVar58._12_4_ = (int)(auVar57._12_4_ + auVar35._12_4_);
              auVar35 = vpackssdw_avx(auVar58,auVar58);
              auVar35 = vpminsw_avx(auVar35,auVar45);
              auVar35 = vpmaxsw_avx(auVar35,auVar49);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              in_ZMM6 = ZEXT1664(auVar35);
              *(int *)*pauVar17 = auVar35._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              pfVar27 = pfVar27 + 4;
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
        }
        if (iVar15 == 1) {
          uVar24 = 0;
          if (1 < max_kk) {
            iVar20 = 1;
            do {
              auVar35 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
              auVar66 = vgatherdps(ZEXT816(0) << 0x40,auVar35);
              auVar35 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
              auVar35 = vgatherdps(ZEXT816(0) << 0x40,auVar35);
              auVar59._0_4_ = auVar66._0_4_ * fVar2;
              auVar59._4_4_ = auVar66._4_4_ * fVar3;
              auVar59._8_4_ = auVar66._8_4_ * fVar10;
              auVar59._12_4_ = auVar66._12_4_ * fVar6;
              auVar69._0_4_ = auVar35._0_4_ * fVar2;
              auVar69._4_4_ = auVar35._4_4_ * fVar3;
              auVar69._8_4_ = auVar35._8_4_ * fVar10;
              auVar69._12_4_ = auVar35._12_4_ * fVar6;
              auVar81 = vunpcklps_avx(auVar59,auVar69);
              auVar72 = vunpckhps_avx(auVar59,auVar69);
              auVar35 = vandps_avx(auVar81,auVar38);
              auVar66 = vandps_avx(auVar72,auVar38);
              auVar35 = vorps_avx(auVar35,auVar41);
              auVar66 = vorps_avx(auVar66,auVar41);
              auVar70._0_4_ = (int)(auVar81._0_4_ + auVar35._0_4_);
              auVar70._4_4_ = (int)(auVar81._4_4_ + auVar35._4_4_);
              auVar70._8_4_ = (int)(auVar81._8_4_ + auVar35._8_4_);
              auVar70._12_4_ = (int)(auVar81._12_4_ + auVar35._12_4_);
              auVar60._0_4_ = (int)(auVar66._0_4_ + auVar72._0_4_);
              auVar60._4_4_ = (int)(auVar66._4_4_ + auVar72._4_4_);
              auVar60._8_4_ = (int)(auVar66._8_4_ + auVar72._8_4_);
              auVar60._12_4_ = (int)(auVar66._12_4_ + auVar72._12_4_);
              auVar35 = vpackssdw_avx(auVar70,auVar60);
              auVar35 = vpminsw_avx(auVar35,auVar45);
              auVar35 = vpmaxsw_avx(auVar35,auVar49);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              in_ZMM6 = ZEXT1664(auVar35);
              *(long *)*pauVar17 = auVar35._0_8_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 8);
              iVar20 = iVar20 + 2;
              uVar24 = max_kk & 0xfffffffeU;
            } while (iVar20 < max_kk);
          }
          iVar20 = max_kk - uVar24;
          if (iVar20 != 0 && (int)uVar24 <= max_kk) {
            do {
              auVar35 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
              auVar35 = vgatherdps((undefined1  [16])0x0,auVar35);
              auVar61._0_4_ = auVar35._0_4_ * fVar2;
              auVar61._4_4_ = auVar35._4_4_ * fVar3;
              auVar61._8_4_ = auVar35._8_4_ * fVar10;
              auVar61._12_4_ = auVar35._12_4_ * fVar6;
              auVar35 = vandps_avx(auVar61,auVar38);
              auVar35 = vorps_avx(auVar35,auVar41);
              auVar62._0_4_ = (int)(auVar61._0_4_ + auVar35._0_4_);
              auVar62._4_4_ = (int)(auVar61._4_4_ + auVar35._4_4_);
              auVar62._8_4_ = (int)(auVar61._8_4_ + auVar35._8_4_);
              auVar62._12_4_ = (int)(auVar61._12_4_ + auVar35._12_4_);
              auVar35 = vpackssdw_avx(auVar62,auVar62);
              auVar35 = vpminsw_avx(auVar35,auVar45);
              auVar35 = vpmaxsw_avx(auVar35,auVar49);
              auVar35 = vpacksswb_avx(auVar35,auVar35);
              in_ZMM6 = ZEXT1664(auVar35);
              *(int *)*pauVar17 = auVar35._0_4_;
              pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
              iVar20 = iVar20 + -1;
            } while (iVar20 != 0);
          }
        }
        uVar30 = uVar25 + 4;
        lVar28 = uVar25 + 7;
        uVar25 = uVar30;
      } while (lVar28 < lVar23);
    }
    lVar28 = (long)k;
    if ((int)((uint)uVar30 | 1) < max_ii) {
      lVar34 = (uVar30 & 0xffffffff) + lVar21;
      lVar26 = (lVar34 * 4 + 4) * lVar18 + lVar28 * 4;
      lVar34 = lVar28 * 4 + lVar34 * lVar18 * 4;
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar39._8_4_ = 0x3f000000;
      auVar39._0_8_ = 0x3f0000003f000000;
      auVar39._12_4_ = 0x3f000000;
      auVar42._8_2_ = 0x7f;
      auVar42._0_8_ = 0x7f007f007f007f;
      auVar42._10_2_ = 0x7f;
      auVar42._12_2_ = 0x7f;
      auVar42._14_2_ = 0x7f;
      auVar46._8_2_ = 0xff81;
      auVar46._0_8_ = 0xff81ff81ff81ff81;
      auVar46._10_2_ = 0xff81;
      auVar46._12_2_ = 0xff81;
      auVar46._14_2_ = 0xff81;
      auVar50._8_4_ = 0x80000000;
      auVar50._0_8_ = 0x8000000080000000;
      auVar50._12_4_ = 0x80000000;
      auVar53._8_4_ = 0x3effffff;
      auVar53._0_8_ = 0x3effffff3effffff;
      auVar53._12_4_ = 0x3effffff;
      uVar25 = uVar30 & 0xffffffff;
      do {
        lVar33 = uVar25 + lVar21;
        fVar2 = *(float *)((long)scales->data + lVar33 * 4);
        auVar63._4_4_ = fVar2;
        auVar63._0_4_ = fVar2;
        auVar63._8_4_ = fVar2;
        auVar63._12_4_ = fVar2;
        fVar3 = *(float *)((long)scales->data + lVar33 * 4 + 4);
        auVar71._4_4_ = fVar3;
        auVar71._0_4_ = fVar3;
        auVar71._8_4_ = fVar3;
        auVar71._12_4_ = fVar3;
        pvVar4 = A->data;
        puVar32 = (ulong *)((long)pvVar4 + lVar28 * 4 + lVar33 * lVar18 * 4);
        if (max_kk < 4) {
          uVar24 = 0;
        }
        else {
          iVar15 = 3;
          lVar33 = 0;
          do {
            pfVar27 = (float *)((long)pvVar4 + lVar33 * 2 + lVar34);
            auVar73._0_4_ = fVar2 * *pfVar27;
            auVar73._4_4_ = fVar2 * pfVar27[1];
            auVar73._8_4_ = fVar2 * pfVar27[2];
            auVar73._12_4_ = fVar2 * pfVar27[3];
            pfVar27 = (float *)((long)pvVar4 + lVar33 * 2 + lVar26);
            auVar75._0_4_ = fVar3 * *pfVar27;
            auVar75._4_4_ = fVar3 * pfVar27[1];
            auVar75._8_4_ = fVar3 * pfVar27[2];
            auVar75._12_4_ = fVar3 * pfVar27[3];
            auVar72 = vmovlhps_avx(auVar73,auVar75);
            auVar81 = vunpckhpd_avx(auVar73,auVar75);
            auVar35 = vandps_avx(auVar72,auVar36);
            auVar66 = vandps_avx(auVar81,auVar36);
            auVar35 = vorps_avx(auVar35,auVar39);
            auVar66 = vorps_avx(auVar66,auVar39);
            auVar76._0_4_ = (int)(auVar35._0_4_ + auVar72._0_4_);
            auVar76._4_4_ = (int)(auVar35._4_4_ + auVar72._4_4_);
            auVar76._8_4_ = (int)(auVar35._8_4_ + auVar72._8_4_);
            auVar76._12_4_ = (int)(auVar35._12_4_ + auVar72._12_4_);
            auVar74._0_4_ = (int)(auVar66._0_4_ + auVar81._0_4_);
            auVar74._4_4_ = (int)(auVar66._4_4_ + auVar81._4_4_);
            auVar74._8_4_ = (int)(auVar66._8_4_ + auVar81._8_4_);
            auVar74._12_4_ = (int)(auVar66._12_4_ + auVar81._12_4_);
            auVar35 = vpackssdw_avx(auVar76,auVar74);
            auVar35 = vpminsw_avx(auVar35,auVar42);
            auVar35 = vpmaxsw_avx(auVar35,auVar46);
            auVar35 = vpacksswb_avx(auVar35,auVar35);
            *(long *)(*pauVar17 + lVar33) = auVar35._0_8_;
            puVar32 = puVar32 + 2;
            lVar33 = lVar33 + 8;
            iVar15 = iVar15 + 4;
          } while (iVar15 < max_kk);
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar33);
          uVar24 = max_kk & 0xfffffffc;
        }
        if ((int)(uVar24 | 1) < max_kk) {
          auVar35 = vmovlhps_avx(auVar63,auVar71);
          uVar22 = uVar24;
          do {
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)((long)puVar32 + lVar18 * 4);
            auVar84._8_8_ = 0;
            auVar84._0_8_ = *puVar32;
            auVar66 = vmovlhps_avx(auVar84,auVar77);
            auVar78._0_4_ = auVar66._0_4_ * auVar35._0_4_;
            auVar78._4_4_ = auVar66._4_4_ * auVar35._4_4_;
            auVar78._8_4_ = auVar66._8_4_ * auVar35._8_4_;
            auVar78._12_4_ = auVar66._12_4_ * auVar35._12_4_;
            auVar66 = vandps_avx(auVar78,auVar36);
            auVar66 = vorps_avx(auVar66,auVar39);
            auVar79._0_4_ = (int)(auVar78._0_4_ + auVar66._0_4_);
            auVar79._4_4_ = (int)(auVar78._4_4_ + auVar66._4_4_);
            auVar79._8_4_ = (int)(auVar78._8_4_ + auVar66._8_4_);
            auVar79._12_4_ = (int)(auVar78._12_4_ + auVar66._12_4_);
            auVar66 = vpackssdw_avx(auVar79,auVar79);
            auVar66 = vpminsw_avx(auVar66,auVar42);
            auVar66 = vpmaxsw_avx(auVar66,auVar46);
            auVar66 = vpacksswb_avx(auVar66,auVar66);
            *(int *)*pauVar17 = auVar66._0_4_;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
            puVar32 = puVar32 + 1;
            uVar24 = uVar22 + 2;
            iVar15 = uVar22 + 3;
            uVar22 = uVar24;
          } while (iVar15 < max_kk);
        }
        if ((int)uVar24 < max_kk) {
          lVar33 = 0;
          do {
            fVar10 = fVar2 * *(float *)((long)puVar32 + lVar33 * 4);
            auVar35 = vandps_avx(ZEXT416((uint)fVar10),auVar50);
            auVar35 = vorps_avx(auVar35,auVar53);
            auVar35 = ZEXT416((uint)(fVar10 + auVar35._0_4_));
            auVar35 = vroundss_avx(auVar35,auVar35,0xb);
            iVar15 = (int)auVar35._0_4_;
            if (iVar15 < -0x7e) {
              iVar15 = -0x7f;
            }
            if (0x7e < iVar15) {
              iVar15 = 0x7f;
            }
            (*pauVar17)[0] = (char)iVar15;
            fVar10 = fVar3 * *(float *)((long)puVar32 + lVar33 * 4 + lVar18 * 4);
            auVar35 = vandps_avx(ZEXT416((uint)fVar10),auVar50);
            auVar35 = vorps_avx(auVar35,auVar53);
            auVar35 = ZEXT416((uint)(fVar10 + auVar35._0_4_));
            auVar35 = vroundss_avx(auVar35,auVar35,0xb);
            iVar15 = (int)auVar35._0_4_;
            if (iVar15 < -0x7e) {
              iVar15 = -0x7f;
            }
            if (0x7e < iVar15) {
              iVar15 = 0x7f;
            }
            (*pauVar17)[1] = (char)iVar15;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + 2);
            lVar33 = lVar33 + 1;
          } while (max_kk - uVar24 != (int)lVar33);
        }
        uVar30 = uVar25 + 2;
        lVar33 = uVar25 + 3;
        lVar26 = lVar26 + lVar18 * 8;
        lVar34 = lVar34 + lVar18 * 8;
        uVar25 = uVar30;
      } while (lVar33 < lVar23);
    }
    if ((int)uVar30 < max_ii) {
      lVar34 = (long)(int)uVar30;
      auVar37._8_4_ = 0x80000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar37._12_4_ = 0x80000000;
      auVar40._8_4_ = 0x3f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._12_4_ = 0x3f000000;
      auVar43._8_2_ = 0x7f;
      auVar43._0_8_ = 0x7f007f007f007f;
      auVar43._10_2_ = 0x7f;
      auVar43._12_2_ = 0x7f;
      auVar43._14_2_ = 0x7f;
      auVar47._8_2_ = 0xff81;
      auVar47._0_8_ = 0xff81ff81ff81ff81;
      auVar47._10_2_ = 0xff81;
      auVar47._12_2_ = 0xff81;
      auVar47._14_2_ = 0xff81;
      auVar51._8_4_ = 0x3effffff;
      auVar51._0_8_ = 0x3effffff3effffff;
      auVar51._12_4_ = 0x3effffff;
      do {
        fVar2 = *(float *)((long)scales->data + (lVar34 + lVar21) * 4);
        pfVar27 = (float *)((long)A->data + lVar28 * 4 + (lVar34 + lVar21) * lVar18 * 4);
        if (max_kk < 4) {
          uVar24 = 0;
        }
        else {
          iVar15 = 3;
          do {
            auVar64._0_4_ = fVar2 * *pfVar27;
            auVar64._4_4_ = fVar2 * pfVar27[1];
            auVar64._8_4_ = fVar2 * pfVar27[2];
            auVar64._12_4_ = fVar2 * pfVar27[3];
            auVar35 = vandps_avx(auVar64,auVar37);
            auVar35 = vorps_avx(auVar35,auVar40);
            auVar65._0_4_ = (int)(auVar64._0_4_ + auVar35._0_4_);
            auVar65._4_4_ = (int)(auVar64._4_4_ + auVar35._4_4_);
            auVar65._8_4_ = (int)(auVar64._8_4_ + auVar35._8_4_);
            auVar65._12_4_ = (int)(auVar64._12_4_ + auVar35._12_4_);
            auVar35 = vpackssdw_avx(auVar65,auVar65);
            auVar35 = vpminsw_avx(auVar35,auVar43);
            auVar35 = vpmaxsw_avx(auVar35,auVar47);
            auVar35 = vpacksswb_avx(auVar35,auVar35);
            *(int *)*pauVar17 = auVar35._0_4_;
            pauVar17 = (undefined1 (*) [16])(*pauVar17 + 4);
            pfVar27 = pfVar27 + 4;
            iVar15 = iVar15 + 4;
            uVar24 = max_kk & 0xfffffffc;
          } while (iVar15 < max_kk);
        }
        if ((int)uVar24 < max_kk) {
          lVar26 = 0;
          do {
            auVar35 = vandps_avx(ZEXT416((uint)(fVar2 * pfVar27[lVar26])),auVar37);
            auVar35 = vorps_avx(auVar35,auVar51);
            auVar35 = ZEXT416((uint)(fVar2 * pfVar27[lVar26] + auVar35._0_4_));
            auVar35 = vroundss_avx(auVar35,auVar35,0xb);
            iVar15 = (int)auVar35._0_4_;
            if (iVar15 < -0x7e) {
              iVar15 = -0x7f;
            }
            if (0x7e < iVar15) {
              iVar15 = 0x7f;
            }
            (*pauVar17)[lVar26] = (char)iVar15;
            lVar26 = lVar26 + 1;
          } while (max_kk - uVar24 != (int)lVar26);
          pauVar17 = (undefined1 (*) [16])(*pauVar17 + lVar26);
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != lVar23);
    }
  }
  else {
    pack_A_tile_fp32_to_int8_avxvnni(A,AT,i,max_ii,k,max_kk,scales);
  }
  return;
}

Assistant:

void pack_A_tile_fp32_to_int8_avx2(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}